

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmaster.c
# Opt level: O1

void jinit_c_master_control(j_compress_ptr cinfo,boolean transcode_only)

{
  jpeg_scan_info *pjVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  jpeg_error_mgr *pjVar6;
  bool bVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int iVar10;
  jpeg_comp_master *pjVar11;
  long lVar12;
  int *piVar13;
  size_t __n;
  ulong uVar14;
  uint *puVar15;
  int iVar16;
  int iVar17;
  jpeg_scan_info *pjVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  jpeg_scan_info *pjVar22;
  long lVar23;
  jpeg_component_info *pjVar24;
  ulong uVar25;
  ulong uVar26;
  boolean component_sent [10];
  uint local_a68 [12];
  uint local_a38 [642];
  
  pjVar11 = (jpeg_comp_master *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x30);
  cinfo->master = pjVar11;
  pjVar11->prepare_for_pass = prepare_for_pass;
  pjVar11->pass_startup = pass_startup;
  pjVar11->finish_pass = finish_pass_master;
  pjVar11->is_last_pass = 0;
  if (transcode_only == 0) {
    jpeg_calc_jpeg_dimensions(cinfo);
  }
  else {
    iVar16 = cinfo->min_DCT_h_scaled_size;
    if (iVar16 != cinfo->min_DCT_v_scaled_size) {
      pjVar6 = cinfo->err;
      pjVar6->msg_code = 7;
      (pjVar6->msg_parm).i[0] = iVar16;
      (cinfo->err->msg_parm).i[1] = cinfo->min_DCT_v_scaled_size;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    cinfo->block_size = cinfo->min_DCT_h_scaled_size;
  }
  iVar16 = cinfo->block_size;
  if (iVar16 - 0x11U < 0xfffffff0) {
    pjVar6 = cinfo->err;
    pjVar6->msg_code = 7;
    (pjVar6->msg_parm).i[0] = iVar16;
    (cinfo->err->msg_parm).i[1] = cinfo->block_size;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  iVar16 = cinfo->block_size;
  if (iVar16 - 2U < 6) {
    piVar13 = (int *)(&PTR_jpeg_natural_order2_00226880)[iVar16 - 2U];
  }
  else {
    piVar13 = jpeg_natural_order;
  }
  iVar10 = 0x3f;
  if (iVar16 < 8) {
    iVar10 = iVar16 * iVar16 + -1;
  }
  cinfo->natural_order = piVar13;
  cinfo->lim_Se = iVar10;
  if ((((cinfo->jpeg_height == 0) || (cinfo->jpeg_width == 0)) || (cinfo->num_components < 1)) ||
     (cinfo->input_components < 1)) {
    pjVar6 = cinfo->err;
    pjVar6->msg_code = 0x21;
    (*pjVar6->error_exit)((j_common_ptr)cinfo);
  }
  if ((0xffdc < cinfo->jpeg_height) || (0xffdc < cinfo->jpeg_width)) {
    *(undefined8 *)&cinfo->err->msg_code = 0xffdc0000002a;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  if ((long)cinfo->input_components * (ulong)cinfo->image_width >> 0x20 != 0) {
    pjVar6 = cinfo->err;
    pjVar6->msg_code = 0x48;
    (*pjVar6->error_exit)((j_common_ptr)cinfo);
  }
  iVar16 = cinfo->data_precision;
  if (iVar16 != 8) {
    pjVar6 = cinfo->err;
    pjVar6->msg_code = 0x10;
    (pjVar6->msg_parm).i[0] = iVar16;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  iVar16 = cinfo->num_components;
  if (10 < iVar16) {
    pjVar6 = cinfo->err;
    pjVar6->msg_code = 0x1b;
    (pjVar6->msg_parm).i[0] = iVar16;
    (cinfo->err->msg_parm).i[1] = 10;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  cinfo->max_h_samp_factor = 1;
  cinfo->max_v_samp_factor = 1;
  if (0 < cinfo->num_components) {
    piVar13 = &cinfo->comp_info->h_samp_factor;
    iVar16 = 0;
    do {
      if ((*piVar13 - 5U < 0xfffffffc) || (piVar13[1] - 5U < 0xfffffffc)) {
        pjVar6 = cinfo->err;
        pjVar6->msg_code = 0x13;
        (*pjVar6->error_exit)((j_common_ptr)cinfo);
      }
      uVar26._0_4_ = cinfo->max_h_samp_factor;
      uVar26._4_4_ = cinfo->max_v_samp_factor;
      uVar14 = *(ulong *)piVar13;
      uVar25 = CONCAT44(-(uint)((int)(uVar14 >> 0x20) < (int)uVar26._4_4_),
                        -(uint)((int)uVar14 < (int)(undefined4)uVar26));
      uVar26 = ~uVar25 & uVar14 | uVar26 & uVar25;
      cinfo->max_h_samp_factor = (int)uVar26;
      cinfo->max_v_samp_factor = (int)(uVar26 >> 0x20);
      iVar16 = iVar16 + 1;
      piVar13 = piVar13 + 0x18;
    } while (iVar16 < cinfo->num_components);
  }
  if (0 < cinfo->num_components) {
    pjVar24 = cinfo->comp_info;
    iVar16 = 0;
    do {
      pjVar24->component_index = iVar16;
      iVar10 = cinfo->min_DCT_h_scaled_size;
      iVar17 = (uint)(cinfo->do_fancy_downsampling != 0) * 4 + 4;
      iVar19 = iVar10;
      if (iVar10 <= iVar17) {
        iVar20 = 1;
        do {
          if (cinfo->max_h_samp_factor % (pjVar24->h_samp_factor * 2 * iVar20) != 0) {
            iVar19 = iVar20 * iVar10;
            break;
          }
          iVar20 = iVar20 * 2;
          iVar19 = iVar20 * iVar10;
        } while (iVar20 * iVar10 <= iVar17);
      }
      pjVar24->DCT_h_scaled_size = iVar19;
      iVar10 = cinfo->min_DCT_v_scaled_size;
      iVar20 = iVar10;
      if (iVar10 <= iVar17) {
        iVar21 = 1;
        do {
          if (cinfo->max_v_samp_factor % (pjVar24->v_samp_factor * 2 * iVar21) != 0) {
            iVar20 = iVar21 * iVar10;
            break;
          }
          iVar21 = iVar21 * 2;
          iVar20 = iVar21 * iVar10;
        } while (iVar21 * iVar10 <= iVar17);
      }
      pjVar24->DCT_v_scaled_size = iVar20;
      iVar10 = iVar20 * 2;
      if (iVar19 == iVar10 || SBORROW4(iVar19,iVar10) != iVar19 + iVar20 * -2 < 0) {
        if (iVar19 * 2 < iVar20) {
          pjVar24->DCT_v_scaled_size = iVar19 * 2;
        }
      }
      else {
        pjVar24->DCT_h_scaled_size = iVar10;
      }
      lVar12 = jdiv_round_up((long)pjVar24->h_samp_factor * (ulong)cinfo->jpeg_width,
                             (long)cinfo->block_size * (long)cinfo->max_h_samp_factor);
      pjVar24->width_in_blocks = (JDIMENSION)lVar12;
      lVar12 = jdiv_round_up((long)pjVar24->v_samp_factor * (ulong)cinfo->jpeg_height,
                             (long)cinfo->block_size * (long)cinfo->max_v_samp_factor);
      pjVar24->height_in_blocks = (JDIMENSION)lVar12;
      lVar12 = jdiv_round_up((long)pjVar24->DCT_h_scaled_size * (long)pjVar24->h_samp_factor *
                             (ulong)cinfo->jpeg_width,
                             (long)cinfo->block_size * (long)cinfo->max_h_samp_factor);
      pjVar24->downsampled_width = (JDIMENSION)lVar12;
      lVar12 = jdiv_round_up((long)pjVar24->DCT_v_scaled_size * (long)pjVar24->v_samp_factor *
                             (ulong)cinfo->jpeg_height,
                             (long)cinfo->block_size * (long)cinfo->max_v_samp_factor);
      pjVar24->downsampled_height = (JDIMENSION)lVar12;
      pjVar24->component_needed = 1;
      iVar16 = iVar16 + 1;
      pjVar24 = pjVar24 + 1;
    } while (iVar16 < cinfo->num_components);
  }
  lVar12 = jdiv_round_up((ulong)cinfo->jpeg_height,
                         (long)cinfo->block_size * (long)cinfo->max_v_samp_factor);
  cinfo->total_iMCU_rows = (JDIMENSION)lVar12;
  if (cinfo->scan_info == (jpeg_scan_info *)0x0) {
    cinfo->progressive_mode = 0;
    iVar16 = 1;
  }
  else {
    if (cinfo->num_scans < 1) {
      *(undefined8 *)&cinfo->err->msg_code = 0x14;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    pjVar22 = cinfo->scan_info;
    if ((pjVar22->Ss == 0) && (pjVar22->Se == 0x3f)) {
      cinfo->progressive_mode = 0;
      if (0 < (long)cinfo->num_components) {
        __n = (long)cinfo->num_components << 2;
        puVar15 = local_a68;
        iVar16 = 0;
LAB_001cd280:
        memset(puVar15,iVar16,__n);
      }
    }
    else {
      cinfo->progressive_mode = 1;
      if (0 < (long)cinfo->num_components) {
        __n = (long)cinfo->num_components << 8;
        puVar15 = local_a38;
        iVar16 = 0xff;
        goto LAB_001cd280;
      }
    }
    if (0 < cinfo->num_scans) {
      iVar16 = 1;
      do {
        uVar2 = pjVar22->comps_in_scan;
        uVar26 = (ulong)uVar2;
        if (uVar2 - 5 < 0xfffffffc) {
          pjVar6 = cinfo->err;
          pjVar6->msg_code = 0x1b;
          (pjVar6->msg_parm).i[0] = uVar2;
          (cinfo->err->msg_parm).i[1] = 4;
          (*cinfo->err->error_exit)((j_common_ptr)cinfo);
        }
        if (0 < (int)uVar2) {
          uVar14 = 0;
          do {
            iVar10 = pjVar22->component_index[uVar14];
            if ((iVar10 < 0) || (cinfo->num_components <= iVar10)) {
              pjVar6 = cinfo->err;
              pjVar6->msg_code = 0x14;
              (pjVar6->msg_parm).i[0] = iVar16;
              (*cinfo->err->error_exit)((j_common_ptr)cinfo);
            }
            if ((uVar14 != 0) && (iVar10 <= pjVar22->component_index[uVar14 - 1])) {
              pjVar6 = cinfo->err;
              pjVar6->msg_code = 0x14;
              (pjVar6->msg_parm).i[0] = iVar16;
              (*cinfo->err->error_exit)((j_common_ptr)cinfo);
            }
            uVar14 = uVar14 + 1;
          } while (uVar26 != uVar14);
        }
        uVar3 = pjVar22->Ss;
        iVar10 = pjVar22->Se;
        uVar4 = pjVar22->Ah;
        uVar5 = pjVar22->Al;
        if (cinfo->progressive_mode == 0) {
          if ((((uVar3 != 0) || (iVar10 != 0x3f)) || (uVar4 != 0)) || (uVar5 != 0)) {
            pjVar6 = cinfo->err;
            pjVar6->msg_code = 0x12;
            (pjVar6->msg_parm).i[0] = iVar16;
            (*cinfo->err->error_exit)((j_common_ptr)cinfo);
          }
          if (0 < (int)uVar2) {
            uVar14 = 0;
            do {
              iVar10 = pjVar22->component_index[uVar14];
              if (local_a68[iVar10] != 0) {
                pjVar6 = cinfo->err;
                pjVar6->msg_code = 0x14;
                (pjVar6->msg_parm).i[0] = iVar16;
                (*cinfo->err->error_exit)((j_common_ptr)cinfo);
              }
              local_a68[iVar10] = 1;
              uVar14 = uVar14 + 1;
            } while (uVar26 != uVar14);
          }
        }
        else {
          if ((0x3f < uVar3) ||
             ((10 < uVar5 || 10 < uVar4) || (0x3f < iVar10 || iVar10 < (int)uVar3))) {
            pjVar6 = cinfo->err;
            pjVar6->msg_code = 0x12;
            (pjVar6->msg_parm).i[0] = iVar16;
            (*cinfo->err->error_exit)((j_common_ptr)cinfo);
          }
          if (uVar3 == 0) {
            if (iVar10 != 0) goto LAB_001cd3b5;
          }
          else if (uVar2 != 1) {
LAB_001cd3b5:
            pjVar6 = cinfo->err;
            pjVar6->msg_code = 0x12;
            (pjVar6->msg_parm).i[0] = iVar16;
            (*cinfo->err->error_exit)((j_common_ptr)cinfo);
          }
          if (0 < (int)uVar2) {
            uVar14 = 0;
            do {
              lVar12 = (long)pjVar22->component_index[uVar14];
              if ((uVar3 != 0) && ((int)local_a38[lVar12 * 0x40] < 0)) {
                pjVar6 = cinfo->err;
                pjVar6->msg_code = 0x12;
                (pjVar6->msg_parm).i[0] = iVar16;
                (*cinfo->err->error_exit)((j_common_ptr)cinfo);
              }
              if ((int)uVar3 <= iVar10) {
                lVar23 = 0;
                do {
                  if ((int)local_a38[(long)(int)uVar3 + lVar12 * 0x40 + lVar23] < 0) {
                    if (uVar4 != 0) goto LAB_001cd487;
                  }
                  else if (local_a38[(long)(int)uVar3 + lVar12 * 0x40 + lVar23] != uVar4 ||
                           uVar4 - 1 != uVar5) {
LAB_001cd487:
                    pjVar6 = cinfo->err;
                    pjVar6->msg_code = 0x12;
                    (pjVar6->msg_parm).i[0] = iVar16;
                    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
                  }
                  local_a38[(long)(int)uVar3 + lVar12 * 0x40 + lVar23] = uVar5;
                  lVar23 = lVar23 + 1;
                } while ((iVar10 - uVar3) + 1 != (int)lVar23);
              }
              uVar14 = uVar14 + 1;
            } while (uVar14 != uVar26);
          }
        }
        pjVar22 = pjVar22 + 1;
        bVar7 = iVar16 < cinfo->num_scans;
        iVar16 = iVar16 + 1;
      } while (bVar7);
    }
    if (cinfo->progressive_mode == 0) {
      if (0 < cinfo->num_components) {
        lVar12 = 0;
        do {
          if (local_a68[lVar12] == 0) {
            pjVar6 = cinfo->err;
            pjVar6->msg_code = 0x2e;
            (*pjVar6->error_exit)((j_common_ptr)cinfo);
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < cinfo->num_components);
      }
    }
    else if (0 < cinfo->num_components) {
      puVar15 = local_a38;
      lVar12 = 0;
      do {
        if ((int)*puVar15 < 0) {
          pjVar6 = cinfo->err;
          pjVar6->msg_code = 0x2e;
          (*pjVar6->error_exit)((j_common_ptr)cinfo);
        }
        lVar12 = lVar12 + 1;
        puVar15 = puVar15 + 0x40;
      } while (lVar12 < cinfo->num_components);
    }
    if (7 < cinfo->block_size) goto LAB_001cd67a;
    if (cinfo->num_scans < 1) {
      iVar16 = 0;
    }
    else {
      pjVar22 = cinfo->scan_info;
      uVar14 = 0;
      uVar26 = 0;
      pjVar18 = pjVar22;
      do {
        iVar16 = (int)uVar26;
        if (uVar14 != uVar26) {
          pjVar22[iVar16].Al = pjVar18->Al;
          iVar10 = pjVar18->comps_in_scan;
          iVar19 = pjVar18->component_index[0];
          uVar8 = *(undefined8 *)(pjVar18->component_index + 1);
          uVar9 = *(undefined8 *)&pjVar18->Se;
          *(undefined8 *)(pjVar22[iVar16].component_index + 3) =
               *(undefined8 *)(pjVar18->component_index + 3);
          *(undefined8 *)(pjVar22[iVar16].component_index + 3 + 2) = uVar9;
          pjVar1 = pjVar22 + iVar16;
          pjVar1->comps_in_scan = iVar10;
          pjVar1->component_index[0] = iVar19;
          *(undefined8 *)(pjVar1->component_index + 1) = uVar8;
        }
        iVar10 = cinfo->lim_Se;
        if (pjVar22[iVar16].Ss <= iVar10) {
          if (iVar10 < pjVar22[iVar16].Se) {
            pjVar22[iVar16].Se = iVar10;
          }
          uVar26 = (ulong)(iVar16 + 1);
        }
        iVar16 = (int)uVar26;
        uVar14 = uVar14 + 1;
        pjVar18 = pjVar18 + 1;
      } while ((long)uVar14 < (long)cinfo->num_scans);
    }
  }
  cinfo->num_scans = iVar16;
LAB_001cd67a:
  if (((cinfo->progressive_mode != 0) || (cinfo->block_size < 8)) && (cinfo->arith_code == 0)) {
    cinfo->optimize_coding = 1;
  }
  if (transcode_only == 0) {
    *(undefined4 *)&pjVar11[1].prepare_for_pass = 0;
  }
  else if (cinfo->optimize_coding == 0) {
    *(undefined4 *)&pjVar11[1].prepare_for_pass = 2;
  }
  else {
    *(undefined4 *)&pjVar11[1].prepare_for_pass = 1;
  }
  *(undefined4 *)((long)&pjVar11[1].pass_startup + 4) = 0;
  *(undefined4 *)((long)&pjVar11[1].prepare_for_pass + 4) = 0;
  *(int *)&pjVar11[1].pass_startup = cinfo->num_scans << (cinfo->optimize_coding != 0);
  return;
}

Assistant:

GLOBAL(void)
jinit_c_master_control (j_compress_ptr cinfo, boolean transcode_only)
{
  my_master_ptr master;

  master = (my_master_ptr)
      (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				  SIZEOF(my_comp_master));
  cinfo->master = (struct jpeg_comp_master *) master;
  master->pub.prepare_for_pass = prepare_for_pass;
  master->pub.pass_startup = pass_startup;
  master->pub.finish_pass = finish_pass_master;
  master->pub.is_last_pass = FALSE;

  /* Validate parameters, determine derived values */
  initial_setup(cinfo, transcode_only);

  if (cinfo->scan_info != NULL) {
#ifdef C_MULTISCAN_FILES_SUPPORTED
    validate_script(cinfo);
    if (cinfo->block_size < DCTSIZE)
      reduce_script(cinfo);
#else
    ERREXIT(cinfo, JERR_NOT_COMPILED);
#endif
  } else {
    cinfo->progressive_mode = FALSE;
    cinfo->num_scans = 1;
  }

  if ((cinfo->progressive_mode || cinfo->block_size < DCTSIZE) &&
      !cinfo->arith_code)			/*  TEMPORARY HACK ??? */
    /* assume default tables no good for progressive or downscale mode */
    cinfo->optimize_coding = TRUE;

  /* Initialize my private state */
  if (transcode_only) {
    /* no main pass in transcoding */
    if (cinfo->optimize_coding)
      master->pass_type = huff_opt_pass;
    else
      master->pass_type = output_pass;
  } else {
    /* for normal compression, first pass is always this type: */
    master->pass_type = main_pass;
  }
  master->scan_number = 0;
  master->pass_number = 0;
  if (cinfo->optimize_coding)
    master->total_passes = cinfo->num_scans * 2;
  else
    master->total_passes = cinfo->num_scans;
}